

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

void __thiscall spirv_cross::Variant::set(Variant *this,IVariant *val,Types new_type)

{
  _Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
  _Var1;
  CompilerError *this_00;
  
  if (this->holder != (IVariant *)0x0) {
    (**(code **)(*(long *)this->group->pools[this->type]._M_t.
                          super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false> + 0x10))();
  }
  this->holder = (IVariant *)0x0;
  if ((this->allow_type_rewrite == false) && (this->type != new_type && this->type != TypeNone)) {
    if (val != (IVariant *)0x0) {
      _Var1.super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl =
           this->group->pools[new_type]._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>;
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>.
                            _M_head_impl + 0x10))
                (_Var1.super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,val)
      ;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Overwriting a variant with new type.");
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->holder = val;
  this->type = new_type;
  this->allow_type_rewrite = false;
  return;
}

Assistant:

void set(IVariant *val, Types new_type)
	{
		if (holder)
			group->pools[type]->deallocate_opaque(holder);
		holder = nullptr;

		if (!allow_type_rewrite && type != TypeNone && type != new_type)
		{
			if (val)
				group->pools[new_type]->deallocate_opaque(val);
			SPIRV_CROSS_THROW("Overwriting a variant with new type.");
		}

		holder = val;
		type = new_type;
		allow_type_rewrite = false;
	}